

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

Option<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&> __thiscall
Lib::
Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::tryGet(Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this,FuncTerm **key)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  FuncTerm *pFVar4;
  FuncTerm **in_RDX;
  FuncTerm *pFVar5;
  Stack<Kernel::PolyNf> *pSVar6;
  
  uVar3 = hashCode((Map<const_Kernel::FuncTerm_*,_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
                    *)key,in_RDX);
  pFVar4 = key[1];
  pSVar6 = (Stack<Kernel::PolyNf> *)0x0;
  pFVar5 = (FuncTerm *)(&pFVar4->_fun + ((ulong)uVar3 % (ulong)*(uint *)key) * 2);
  do {
    uVar1 = (pFVar5->_fun)._num;
    if (uVar1 == 0) {
LAB_003ca3a5:
      *(Stack<Kernel::PolyNf> **)this = pSVar6;
      return (OptionBase<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&>)
             (OptionBase<const_Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>_&>)this;
    }
    if (uVar1 == uVar3) {
      bVar2 = Kernel::operator==((FuncTerm *)(pFVar5->_fun)._typeArgs,*in_RDX);
      if (bVar2) {
        pSVar6 = &pFVar5->_args;
        goto LAB_003ca3a5;
      }
      pFVar4 = key[1];
    }
    pFVar5 = (FuncTerm *)&(pFVar5->_args)._cursor;
    if (pFVar5 == key[2]) {
      pFVar5 = pFVar4;
    }
  } while( true );
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }